

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_query_tests.cpp
# Opt level: O1

void __thiscall
QueryTests_InsertInto_canDetermineSpecificationForInsertInto_Test::
~QueryTests_InsertInto_canDetermineSpecificationForInsertInto_Test
          (QueryTests_InsertInto_canDetermineSpecificationForInsertInto_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(QueryTests_InsertInto,canDetermineSpecificationForInsertInto)
{
  database::Query query_insert_into = "insert into company.employee values(employee_id:1,employee_name:chandan,employee_status:fulltime)";
  ASSERT_TRUE(query_insert_into.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_insert_into.databaseName() == "company");
  ASSERT_TRUE(query_insert_into.containerName() == "employee");
  std::map<std::string,std::string> values = {
    {"employee_id","1"},
    {"employee_name","chandan"},
    {"employee_status","fulltime"}
  };
  ASSERT_TRUE(query_insert_into.values() == values);
}